

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayFeatureExtractor.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ArrayFeatureExtractor::ArrayFeatureExtractor
          (ArrayFeatureExtractor *this,ArrayFeatureExtractor *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ArrayFeatureExtractor_007092a8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->extractindex_).current_size_ = 0;
  (this->extractindex_).total_size_ = 0;
  (this->extractindex_).rep_ = (Rep *)0x0;
  new_size = (from->extractindex_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->extractindex_,new_size);
    memcpy(((this->extractindex_).rep_)->elements,((from->extractindex_).rep_)->elements,
           (long)(from->extractindex_).current_size_ << 3);
    (this->extractindex_).current_size_ = (from->extractindex_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

ArrayFeatureExtractor::ArrayFeatureExtractor(const ArrayFeatureExtractor& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      extractindex_(from.extractindex_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ArrayFeatureExtractor)
}